

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphic.h
# Opt level: O2

void __thiscall
mpt::updates<const_mpt::convertable_*,_mpt::graphic::hint>::compress
          (updates<const_mpt::convertable_*,_mpt::graphic::hint> *this,int mask)

{
  long *plVar1;
  updates<const_mpt::convertable_*,_mpt::graphic::hint> uVar2;
  long *plVar3;
  char cVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  int *piVar11;
  int *piVar12;
  long *plVar13;
  
  uVar2 = *this;
  if (uVar2 == (updates<const_mpt::convertable_*,_mpt::graphic::hint>)0x0) {
    lVar9 = 0;
  }
  else {
    lVar9 = 0;
    if (*(long *)((long)uVar2 + 8) == 0) {
      lVar9 = (long)uVar2 + 0x20;
    }
  }
  lVar5 = length(this);
  lVar7 = 0;
  lVar6 = 0;
  if (0 < lVar5) {
    lVar6 = lVar5;
  }
  piVar11 = (int *)(lVar9 + 0x1c);
  lVar8 = 1;
  plVar13 = (long *)0x0;
  do {
    if (lVar7 == lVar6) {
      if (*this == (updates<const_mpt::convertable_*,_mpt::graphic::hint>)0x0) {
        return;
      }
      mpt::array::content::set_length((ulong)*this);
      return;
    }
    plVar1 = (long *)(lVar9 + lVar7 * 0x10);
    if (*(int *)(lVar9 + 0xc + lVar7 * 0x10) == 0) {
      if (plVar13 == (long *)0x0) {
        plVar13 = plVar1;
      }
    }
    else {
      piVar12 = piVar11;
      for (lVar10 = lVar8; lVar10 < lVar5; lVar10 = lVar10 + 1) {
        if (((*piVar12 != 0) && (*plVar1 == *(long *)(piVar12 + -3))) &&
           (cVar4 = mpt::graphic::hint::merge((hint *)(plVar1 + 1),(int)piVar12 + -4), cVar4 != '\0'
           )) {
          *(int *)((long)plVar1 + 0xcU) = *(int *)((long)plVar1 + 0xcU) + *piVar12;
          *piVar12 = 0;
        }
        piVar12 = piVar12 + 4;
      }
      if (plVar13 == (long *)0x0) {
        plVar13 = (long *)0x0;
      }
      else {
        lVar10 = plVar1[1];
        *plVar13 = *plVar1;
        plVar13[1] = lVar10;
        *(undefined4 *)((long)plVar1 + 0xc) = 0;
        plVar3 = plVar13;
        do {
          plVar13 = plVar3 + 2;
          if (plVar1 <= plVar13) break;
          piVar12 = (int *)((long)plVar3 + 0x1c);
          plVar3 = plVar13;
        } while (*piVar12 != 0);
      }
    }
    lVar7 = lVar7 + 1;
    lVar8 = lVar8 + 1;
    piVar11 = piVar11 + 4;
  } while( true );
}

Assistant:

void compress(int mask = 0) {
		element *u = 0, *c = static_cast<element *>(base());
		long len = 0;
		
		for (long i = 0, max = length(); i < max; ++i) {
			if (!c[i].used) {
				if (!u) u = c + i;
				continue;
			}
			for (long j = i + 1; j < max; ++j) {
				if (!c[j].used || c[i].data != c[j].data) {
					continue;
				}
				if (!c[i].hint.merge(c[j].hint, mask)) {
					continue;
				}
				c[i].used += c[j].used;
				c[j].invalidate();
			}
			++len;
			
			if (!u) {
				continue;
			}
			*u = c[i];
			c[i].invalidate();
			
			while (++u < c + i) {
				if (!u->used) {
					break;
				}
			}
		}
		content *d;
		if ((d = _buf.instance())) {
			d->set_length(len * sizeof(*c));
		}
	}